

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

gfield * __thiscall gfield::div2<13>(gfield *this,bigint<13> *x)

{
  bool bVar1;
  bigint<13> *x_local;
  gfield *this_local;
  
  bVar1 = bigint<13>::hasbit(&this->super_gfint,0);
  if (bVar1) {
    bigint<13>::add<13,13>(&this->super_gfint,x,&P.super_gfint);
    bigint<13>::rshift(&this->super_gfint,1);
  }
  else {
    bigint<13>::rshift<13>(&this->super_gfint,x,1);
  }
  return this;
}

Assistant:

gfield &div2(const bigint<X_DIGITS> &x)
    {
        if(hasbit(0)) { gfint::add(x, P); rshift(1); }
        else rshift(x, 1);
        return *this;
    }